

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::insert_internal(tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *this,key_type k,value_view v,bool bypass_verifier)

{
  value_view v_00;
  bool bVar1;
  char *pcVar2;
  const_reference pvVar3;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_00;
  char *in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_bool>
  pVar4;
  size_t local_420;
  string local_410;
  AssertHelper local_3f0;
  Message local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__1;
  type *insert_succeeded;
  type *pos;
  ikey_type<unodb::mutex_db<std::uint64_t,_unodb::value_view>_> local_3b0;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_bool>
  local_3a8;
  pause_heap_faults local_391;
  pause_heap_faults guard;
  Message local_388;
  unsigned_long local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_9;
  Message local_360;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_8;
  value_type_conflict2 leaf_count_after;
  Message local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_7;
  Message local_310;
  int local_304;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_6;
  size_t mem_use_after;
  AssertHelper local_2c8;
  Message local_2c0;
  bool local_2b1;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint64_t key_prefix_splits_before;
  inode_type_counter_array shrinking_inodes_before;
  inode_type_counter_array growing_inodes_before;
  node_type_counter_array node_counts_before;
  size_t mem_use_before;
  bool empty_before;
  bool bypass_verifier_local;
  key_type k_local;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  value_view v_local;
  
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  this_local = (tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *)v._M_ptr;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::empty
            (&this->test_db);
  if ((this->parallel_test & 1U) == 0) {
    local_420 = mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                get_current_memory_use(&this->test_db);
  }
  else {
    local_420 = 0;
  }
  node_counts_before._M_elems[4] = local_420;
  this_00 = &this->test_db;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_node_counts
            ((node_type_counter_array *)(growing_inodes_before._M_elems + 3),this_00);
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  get_growing_inode_counts
            ((inode_type_counter_array *)(shrinking_inodes_before._M_elems + 3),this_00);
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  get_shrinking_inode_counts((inode_type_counter_array *)&key_prefix_splits_before,this_00);
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  get_key_prefix_splits(this_00);
  v_00._M_extent._M_extent_value = (size_t)v_local._M_ptr;
  v_00._M_ptr = (pointer)this_local;
  tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
  do_insert<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            ((tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)this,k,v_00);
  bVar1 = mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::empty
                    (&this->test_db);
  local_2b1 = !bVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b0,&local_2b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mem_use_after,(internal *)local_2b0,(AssertionResult *)"test_db.empty()",
               "true","false",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &mem_use_after);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x18b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    std::__cxx11::string::~string((string *)&mem_use_after);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  if (bVar1) {
    gtest_ar_6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
           get_current_memory_use(&this->test_db);
    if ((this->parallel_test & 1U) == 0) {
      testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                ((internal *)local_328,"(mem_use_before)","(mem_use_after)",
                 node_counts_before._M_elems + 4,(unsigned_long *)&gtest_ar_6.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
      if (!bVar1) {
        testing::Message::Message(&local_330);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_count_after,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x192,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&leaf_count_after,&local_330);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_count_after);
        testing::Message::~Message(&local_330);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
    }
    else {
      local_304 = 0;
      testing::internal::CmpHelperGT<unsigned_long,int>
                ((internal *)local_300,"(mem_use_after)","(0)",(unsigned_long *)&gtest_ar_6.message_
                 ,&local_304);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
      if (!bVar1) {
        testing::Message::Message(&local_310);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,400,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_310);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_310);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
    }
    if (bVar1) {
      gtest_ar_8.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
             get_node_count<(unodb::node_type)0>(&this->test_db);
      if ((this->parallel_test & 1U) == 0) {
        pvVar3 = std::array<unsigned_long,_5UL>::operator[]
                           ((array<unsigned_long,_5UL> *)(growing_inodes_before._M_elems + 3),0);
        local_380 = *pvVar3 + 1;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_378,"(leaf_count_after)",
                   "(node_counts_before[as_i<unodb::node_type::LEAF>] + 1)",
                   (unsigned_long *)&gtest_ar_8.message_,&local_380);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
        if (!bVar1) {
          testing::Message::Message(&local_388);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffc70,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x19a,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffc70,&local_388);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc70);
          testing::Message::~Message(&local_388);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
      }
      else {
        local_354 = 0;
        testing::internal::CmpHelperGT<unsigned_long,int>
                  ((internal *)local_350,"(leaf_count_after)","(0)",
                   (unsigned_long *)&gtest_ar_8.message_,&local_354);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
        if (!bVar1) {
          testing::Message::Message(&local_360);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x197,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_9.message_,&local_360);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
          testing::Message::~Message(&local_360);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
      }
      if ((bVar1) && (!bypass_verifier)) {
        allocation_failure_injector::reset();
        pause_heap_faults::pause_heap_faults(&local_391);
        local_3b0 = to_ikey(this,k);
        pVar4 = std::
                map<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::comparator,std::allocator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                ::try_emplace<std::span<std::byte_const,18446744073709551615ul>&>
                          ((map<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::comparator,std::allocator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                            *)&this->values,&local_3b0,
                           (span<const_std::byte,_18446744073709551615UL> *)&this_local);
        local_3a8.first = pVar4.first._M_node;
        local_3a8.second = pVar4.second;
        std::
        get<0ul,std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>,bool>
                  (&local_3a8);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )std::
               get<1ul,std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>,bool>
                         (&local_3a8);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_3e0,
                   (bool *)gtest_ar__1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
        if (!bVar1) {
          testing::Message::Message(&local_3e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_410,(internal *)local_3e0,(AssertionResult *)"insert_succeeded","false",
                     "true",in_R9);
          pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str(&local_410);
          testing::internal::AssertHelper::AssertHelper
                    (&local_3f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x1a4,pcVar2);
          testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
          testing::internal::AssertHelper::~AssertHelper(&local_3f0);
          std::__cxx11::string::~string((string *)&local_410);
          testing::Message::~Message(&local_3e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
        pause_heap_faults::~pause_heap_faults(&local_391);
      }
    }
  }
  return;
}

Assistant:

void insert_internal(key_type k, unodb::value_view v,
                       bool bypass_verifier = false) {
    const auto empty_before = test_db.empty();
#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_before =
        parallel_test ? 0 : test_db.get_current_memory_use();
    const auto node_counts_before = test_db.get_node_counts();
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      do_insert(k, v);
    } catch (...) {
      if (!parallel_test) {
        UNODB_ASSERT_EQ(empty_before, test_db.empty());
#ifdef UNODB_DETAIL_WITH_STATS
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
#endif  // UNODB_DETAIL_WITH_STATS
      }
      throw;
    }

    UNODB_ASSERT_FALSE(test_db.empty());

#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_after = test_db.get_current_memory_use();
    if (parallel_test)
      UNODB_ASSERT_GT(mem_use_after, 0);
    else
      UNODB_ASSERT_LT(mem_use_before, mem_use_after);

    const auto leaf_count_after =
        test_db.template get_node_count<unodb::node_type::LEAF>();
    if (parallel_test)
      UNODB_ASSERT_GT(leaf_count_after, 0);
    else
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] + 1);
#endif  // UNODB_DETAIL_WITH_STATS

    if (!bypass_verifier) {
#ifndef NDEBUG
      allocation_failure_injector::reset();
#endif
      UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
      const auto [pos, insert_succeeded] = values.try_emplace(to_ikey(k), v);
      (void)pos;
      UNODB_ASSERT_TRUE(insert_succeeded);
    }
  }